

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O1

bool duckdb_pending_execution_is_finished(duckdb_pending_state pending_state)

{
  bool bVar1;
  PendingExecutionResult result;
  
  result = EXECUTION_ERROR;
  if (pending_state < 4) {
    result = (PendingExecutionResult)(0x4020100 >> ((char)pending_state * '\b' & 0x1fU));
  }
  bVar1 = duckdb::PendingQueryResult::IsResultReady(result);
  return bVar1;
}

Assistant:

bool duckdb_pending_execution_is_finished(duckdb_pending_state pending_state) {
	switch (pending_state) {
	case DUCKDB_PENDING_RESULT_READY:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::RESULT_READY);
	case DUCKDB_PENDING_NO_TASKS_AVAILABLE:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::NO_TASKS_AVAILABLE);
	case DUCKDB_PENDING_RESULT_NOT_READY:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::RESULT_NOT_READY);
	case DUCKDB_PENDING_ERROR:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::EXECUTION_ERROR);
	default:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::EXECUTION_ERROR);
	}
}